

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O1

void sen_BLOCK(treeNode *tn)

{
  pointer *ppptVar1;
  iterator iVar2;
  int iVar3;
  treeNode *ptVar4;
  treeNode *complex_sent;
  treeNode *local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
  if (iVar3 == 0) {
    ptVar4 = (treeNode *)operator_new(0x38);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,anon_var_dwarf_7d72,anon_var_dwarf_7d72 + 0xc);
    treeNode::treeNode(ptVar4,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_100 = ptVar4;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_100);
    }
    else {
      *iVar2._M_current = ptVar4;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    assi_sen(local_100);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
    if (iVar3 == 0) {
      ptVar4 = (treeNode *)operator_new(0x38);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,anon_var_dwarf_7d7d,anon_var_dwarf_7d7d + 0xc);
      treeNode::treeNode(ptVar4,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      iVar2._M_current =
           (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_100 = ptVar4;
      if (iVar2._M_current ==
          (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                  ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_100);
      }
      else {
        *iVar2._M_current = ptVar4;
        ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *ppptVar1 = *ppptVar1 + 1;
      }
      condition_sen(local_100);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
      if (iVar3 == 0) {
        ptVar4 = (treeNode *)operator_new(0x38);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,anon_var_dwarf_7d88,anon_var_dwarf_7d88 + 0x12);
        treeNode::treeNode(ptVar4,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        iVar2._M_current =
             (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_100 = ptVar4;
        if (iVar2._M_current ==
            (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                    ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_100);
        }
        else {
          *iVar2._M_current = ptVar4;
          ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *ppptVar1 = *ppptVar1 + 1;
        }
        do_while_sen(local_100);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
        if (iVar3 == 0) {
          ptVar4 = (treeNode *)operator_new(0x38);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,anon_var_dwarf_7d93,anon_var_dwarf_7d93 + 0x12);
          treeNode::treeNode(ptVar4,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          iVar2._M_current =
               (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_100 = ptVar4;
          if (iVar2._M_current ==
              (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                      ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_100);
          }
          else {
            *iVar2._M_current = ptVar4;
            ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *ppptVar1 = *ppptVar1 + 1;
          }
          proc_call_sen(local_100);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
          if (iVar3 == 0) {
            ptVar4 = (treeNode *)operator_new(0x38);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,anon_var_dwarf_7d9e,anon_var_dwarf_7d9e + 9);
            treeNode::treeNode(ptVar4,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            iVar2._M_current =
                 (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_100 = ptVar4;
            if (iVar2._M_current ==
                (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                        ((vector<treeNode*,std::allocator<treeNode*>> *)&tn->child,iVar2,&local_100)
              ;
            }
            else {
              *iVar2._M_current = ptVar4;
              ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *ppptVar1 = *ppptVar1 + 1;
            }
            read_sen(local_100);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
            if (iVar3 == 0) {
              ptVar4 = (treeNode *)operator_new(0x38);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,anon_var_dwarf_7da9,anon_var_dwarf_7da9 + 9);
              treeNode::treeNode(ptVar4,&local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              local_100 = ptVar4;
              std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&local_100)
              ;
              write_sen(local_100);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
              if (iVar3 == 0) {
                ptVar4 = (treeNode *)operator_new(0x38);
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f8,anon_var_dwarf_7db4,anon_var_dwarf_7db4 + 0xc);
                treeNode::treeNode(ptVar4,&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                local_100 = ptVar4;
                std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                          (&tn->child,&local_100);
                complex_sen(local_100);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void sen_BLOCK(treeNode* tn)
{
    if (sym == "identifier") {
        auto *assi_sent = new treeNode("赋值语句");
        tn->child.push_back(assi_sent);
        assi_sen(assi_sent);
    }
    else if (sym == "if") {
        auto *condition_sent = new treeNode("条件语句");
        tn->child.push_back(condition_sent);
        condition_sen(condition_sent);
    }
    else if (sym == "while") {
        auto *do_while_sent = new treeNode("当型循环语句");
        tn->child.push_back(do_while_sent);
        do_while_sen(do_while_sent);
    }
    else if (sym == "call") {
        auto *proc_call_sent = new treeNode("过程调用语句");
        tn->child.push_back(proc_call_sent);
        proc_call_sen(proc_call_sent);
    }
    else if (sym == "read") {
        auto *read_sent = new treeNode("读语句");
        tn->child.push_back(read_sent);
        read_sen(read_sent);
    }
    else if (sym == "write") {
        auto *write_sent = new treeNode("写语句");
        tn->child.push_back(write_sent);
        write_sen(write_sent);
    }
    else if (sym == "begin") {
        auto *complex_sent = new treeNode("复合语句");
        tn->child.push_back(complex_sent);
        complex_sen(complex_sent);
    }
}